

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest14DistributionPoints_::
Section14InvalidIDPwithindirectCRLTest23<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section14InvalidIDPwithindirectCRLTest23
          (Section14InvalidIDPwithindirectCRLTest23<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  Section14InvalidIDPwithindirectCRLTest23<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
  *this_local;
  
  ~Section14InvalidIDPwithindirectCRLTest23(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest14DistributionPoints,
                     Section14InvalidIDPwithindirectCRLTest23) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "indirectCRLCA1Cert",
                               "InvalidIDPwithindirectCRLTest23EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "indirectCRLCA1CRL"};
  PkitsTestInfo info;
  info.test_number = "4.14.23";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}